

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O3

void my_output_message(j_common_ptr cinfo)

{
  long in_FS_OFFSET;
  char buffer [200];
  char acStack_e8 [208];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  memset(acStack_e8,0xaa,200);
  (*cinfo->err->format_message)(cinfo,acStack_e8);
  lcJpeg();
  if (((byte)lcJpeg::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
    my_output_message();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void my_output_message(j_common_ptr cinfo)
{
    char buffer[JMSG_LENGTH_MAX];
    (*cinfo->err->format_message)(cinfo, buffer);
    qCWarning(lcJpeg,"%s", buffer);
}